

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode
JsSerializeScriptCore
          (byte *script,size_t cb,LoadScriptFlag loadScriptFlag,BYTE *functionTable,
          int functionTableSize,uchar *buffer,uint *bufferSize,JsValueRef scriptSource)

{
  anon_class_64_8_7015e041 fn;
  anon_class_32_4_f532edac fn_00;
  uint **ppuVar1;
  undefined1 local_a8 [4];
  JsErrorCode errorCode;
  CompileScriptException se;
  JavascriptFunction *function;
  uchar *buffer_local;
  BYTE *pBStack_30;
  int functionTableSize_local;
  BYTE *functionTable_local;
  uint *puStack_20;
  LoadScriptFlag loadScriptFlag_local;
  size_t cb_local;
  byte *script_local;
  
  function = (JavascriptFunction *)buffer;
  buffer_local._4_4_ = functionTableSize;
  pBStack_30 = functionTable;
  functionTable_local._4_4_ = loadScriptFlag;
  puStack_20 = (uint *)cb;
  cb_local = (size_t)script;
  CompileScriptException::CompileScriptException((CompileScriptException *)local_a8);
  ppuVar1 = &stack0xffffffffffffffe0;
  fn.bufferSize = &bufferSize;
  fn.script = (byte **)&cb_local;
  fn.buffer = (uchar **)&function;
  fn.loadScriptFlag = (LoadScriptFlag *)((long)&functionTable_local + 4);
  fn.cb = (size_t *)ppuVar1;
  fn.function = (JavascriptFunction **)&se.bstrLine;
  fn.se = (CompileScriptException *)local_a8;
  fn.scriptSource = &scriptSource;
  script_local._4_4_ =
       ContextAPINoScriptWrapper_NoRecord<JsSerializeScriptCore(unsigned_char_const*,unsigned_long,LoadScriptFlag,unsigned_char*,int,unsigned_char*,unsigned_int*,void*)::__0>
                 (fn,false,false);
  if (script_local._4_4_ == JsNoError) {
    fn_00.se = (CompileScriptException *)&function;
    fn_00.function = (JavascriptFunction **)local_a8;
    fn_00.buffer = (uchar **)&bufferSize;
    fn_00.bufferSize = ppuVar1;
    script_local._4_4_ =
         ContextAPIWrapper_NoRecord<false,JsSerializeScriptCore(unsigned_char_const*,unsigned_long,LoadScriptFlag,unsigned_char*,int,unsigned_char*,unsigned_int*,void*)::__1>
                   (fn_00);
  }
  CompileScriptException::~CompileScriptException((CompileScriptException *)local_a8);
  return script_local._4_4_;
}

Assistant:

JsErrorCode JsSerializeScriptCore(const byte *script, size_t cb,
    LoadScriptFlag loadScriptFlag, BYTE *functionTable, int functionTableSize,
    unsigned char *buffer, unsigned int *bufferSize, JsValueRef scriptSource)
{
    Js::JavascriptFunction *function;
    CompileScriptException se;

    JsErrorCode errorCode = ContextAPINoScriptWrapper_NoRecord([&](Js::ScriptContext *scriptContext) -> JsErrorCode {
        PARAM_NOT_NULL(script);
        PARAM_NOT_NULL(bufferSize);

        if (*bufferSize > 0)
        {
            PARAM_NOT_NULL(buffer);
            ZeroMemory(buffer, *bufferSize);
        }

        if (scriptContext->IsScriptContextInDebugMode())
        {
            return JsErrorCannotSerializeDebugScript;
        }

        SourceContextInfo * sourceContextInfo = scriptContext->GetSourceContextInfo(JS_SOURCE_CONTEXT_NONE, nullptr);
        Assert(sourceContextInfo != nullptr);
        sourceContextInfo->nextLocalFunctionId = 0;

        const int chsize = (loadScriptFlag & LoadScriptFlag_Utf8Source) ? sizeof(utf8char_t) : sizeof(WCHAR);
        SRCINFO si = {
            /* sourceContextInfo   */ sourceContextInfo,
            /* dlnHost             */ 0,
            /* ulColumnHost        */ 0,
            /* lnMinHost           */ 0,
            /* ichMinHost          */ 0,
            /* ichLimHost          */ static_cast<ULONG>(cb / chsize), // OK to truncate since this is used to limit sourceText in debugDocument/compilation errors.
            /* ulCharOffset        */ 0,
            /* mod                 */ kmodGlobal,
            /* grfsi               */ 0
        };
        bool isSerializeByteCodeForLibrary = false;
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        isSerializeByteCodeForLibrary = JsrtContext::GetCurrent()->GetRuntime()->IsSerializeByteCodeForLibrary();
#endif

        Js::Utf8SourceInfo* sourceInfo = nullptr;
        loadScriptFlag = (LoadScriptFlag)(loadScriptFlag | LoadScriptFlag_disableDeferredParse);
        if (isSerializeByteCodeForLibrary)
        {
            loadScriptFlag = (LoadScriptFlag)(loadScriptFlag | LoadScriptFlag_isByteCodeBufferForLibrary);
        }
        else
        {
            loadScriptFlag = (LoadScriptFlag)(loadScriptFlag | LoadScriptFlag_Expression);
        }
        function = scriptContext->LoadScript(script, cb, &si, &se, &sourceInfo,
            Js::Constants::GlobalCode, loadScriptFlag, scriptSource);
        return JsNoError;
    });

    if (errorCode != JsNoError)
    {
        return errorCode;
    }

    return ContextAPIWrapper_NoRecord<false>([&](Js::ScriptContext* scriptContext) -> JsErrorCode {
        if (function == nullptr)
        {
            HandleScriptCompileError(scriptContext, &se);
            return JsErrorScriptCompile;
        }
        // Could we have a deserialized function in this case?
        // If we are going to serialize it, a check isn't to expensive
        if (CONFIG_FLAG(ForceSerialized) && function->GetFunctionProxy() != nullptr) {
            function->GetFunctionProxy()->EnsureDeserialized();
        }
        Js::FunctionBody *functionBody = function->GetFunctionBody();
        const Js::Utf8SourceInfo *sourceInfo = functionBody->GetUtf8SourceInfo();
        size_t cSourceCodeLength = sourceInfo->GetCbLength(_u("JsSerializeScript"));

        // truncation of code length can lead to accessing random memory. Reject the call.
        if (cSourceCodeLength > DWORD_MAX)
        {
            return JsErrorOutOfMemory;
        }

        LPCUTF8 utf8Code = sourceInfo->GetSource(_u("JsSerializeScript"));
        DWORD dwFlags = 0;
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        dwFlags = JsrtContext::GetCurrent()->GetRuntime()->IsSerializeByteCodeForLibrary() ? GENERATE_BYTE_CODE_BUFFER_LIBRARY : 0;
#endif

        BEGIN_TEMP_ALLOCATOR(tempAllocator, scriptContext, _u("ByteCodeSerializer"));
        // We cast buffer size to DWORD* because on Windows, DWORD = unsigned long = unsigned int
        // On 64-bit clang on linux, this is not true, unsigned long is larger than unsigned int
        // However, the PAL defines DWORD for us on linux as unsigned int so the cast is safe here.
        HRESULT hr = Js::ByteCodeSerializer::SerializeToBuffer(scriptContext,
            tempAllocator, static_cast<DWORD>(cSourceCodeLength), utf8Code,
            functionBody, functionBody->GetHostSrcInfo(), &buffer,
            (DWORD*) bufferSize, dwFlags);
        END_TEMP_ALLOCATOR(tempAllocator, scriptContext);

        if (SUCCEEDED(hr))
        {
            return JsNoError;
        }
        else
        {
            return JsErrorScriptCompile;
        }
    });
}